

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall cmLocalGenerator::AppendFlags(cmLocalGenerator *this,string *flags,string *newFlags)

{
  if (newFlags->_M_string_length != 0) {
    if (flags->_M_string_length != 0) {
      std::__cxx11::string::append((char *)flags);
    }
    std::__cxx11::string::_M_append((char *)flags,(ulong)(newFlags->_M_dataplus)._M_p);
    return;
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendFlags(std::string& flags,
                                   const std::string& newFlags)
{
  if(!newFlags.empty())
    {
    if(!flags.empty())
      {
      flags += " ";
      }
    flags += newFlags;
    }
}